

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall
QHttpThreadDelegate::dataReadProgressSlot(QHttpThreadDelegate *this,qint64 done,qint64 total)

{
  bool bVar1;
  qint64 in_RDX;
  QBasicAtomicInteger<int> *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  bVar1 = QSharedPointer<char>::isNull((QSharedPointer<char> *)0x3104ad);
  if (!bVar1) {
    std::__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x3104c3
              );
    QBasicAtomicInteger<int>::fetchAndAddRelease(in_RDI,in_stack_ffffffffffffffdc);
    downloadProgress((QHttpThreadDelegate *)
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),in_RDX,
                     (qint64)in_RDI);
  }
  return;
}

Assistant:

void QHttpThreadDelegate::dataReadProgressSlot(qint64 done, qint64 total)
{
    // If we don't have a download buffer don't attempt to go this codepath
    // It is not used by QNetworkAccessHttpBackend
    if (downloadBuffer.isNull())
        return;

    pendingDownloadProgress->fetchAndAddRelease(1);
    emit downloadProgress(done, total);
}